

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Plink_delete(plink *plp)

{
  plink *ppVar1;
  plink *nextpl;
  plink *plp_local;
  
  nextpl = plp;
  while (nextpl != (plink *)0x0) {
    ppVar1 = nextpl->next;
    nextpl->next = plink_freelist;
    plink_freelist = nextpl;
    nextpl = ppVar1;
  }
  return;
}

Assistant:

void Plink_delete(struct plink *plp)
{
  struct plink *nextpl;

  while( plp ){
    nextpl = plp->next;
    plp->next = plink_freelist;
    plink_freelist = plp;
    plp = nextpl;
  }
}